

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::StructuredAssignmentPatternExpression::forFixedArray
          (Compilation *comp,StructuredAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Type *elementType,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange assignmentRange;
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  typeSetters_00;
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  Expression *pEVar5;
  raw_key_type *__y;
  Expression **ppEVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  sockaddr *in_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  long in_RSI;
  EVP_PKEY_CTX *in_RDI;
  Type *in_R8;
  SourceRange SVar7;
  StructuredAssignmentPatternExpression *result;
  iterator it;
  int32_t i;
  ConstantRange arrayRange;
  optional<const_slang::ast::Expression_*> cachedVal;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  Diagnostic *diag;
  optional<int> index;
  Expression *expr;
  Type *typeKey;
  Expression *keyExpr;
  AssignmentPatternItemSyntax *item;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *__range2;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL> typeSetters;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL> indexSetters;
  SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  indexMap;
  Expression *defaultSetter;
  bool bad;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements_1;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  Type *in_stack_fffffffffffff908;
  table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  *in_stack_fffffffffffff910;
  Compilation *compilation;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL>
  *in_stack_fffffffffffff918;
  Diagnostic *in_stack_fffffffffffff920;
  Compilation *in_stack_fffffffffffff928;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff930;
  SourceLocation in_stack_fffffffffffff938;
  undefined8 in_stack_fffffffffffff940;
  Type *in_stack_fffffffffffff958;
  Diagnostic *in_stack_fffffffffffff960;
  span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *in_stack_fffffffffffff9a8;
  ASTContext *in_stack_fffffffffffff9b0;
  span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *in_stack_fffffffffffff9b8;
  undefined7 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c7;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff9c8;
  SourceLocation in_stack_fffffffffffff9d0;
  SourceLocation in_stack_fffffffffffff9d8;
  SourceLocation in_stack_fffffffffffff9f0;
  SourceRange *in_stack_fffffffffffff9f8;
  _Optional_payload_base<int> in_stack_fffffffffffffa48;
  sockaddr *psVar8;
  Type *elementType_00;
  SourceLocation in_stack_fffffffffffffa70;
  Expression local_488;
  StructuredAssignmentPatternExpression *local_448;
  Type *local_440;
  table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  *ptStack_438;
  SourceRange local_430;
  Expression *local_420;
  undefined8 local_418;
  undefined8 uStack_410;
  iterator local_408;
  ASTContext *local_3f8;
  span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *local_3f0;
  int local_3e4;
  ConstantRange local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  SmallVectorBase<const_slang::ast::Expression_*> local_3c8;
  Expression *in_stack_fffffffffffffc70;
  FieldSymbol *in_stack_fffffffffffffc78;
  Type *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  SourceLocation in_stack_fffffffffffffc90;
  ConstantRange in_stack_fffffffffffffc98;
  SourceLocation in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  Expression *local_340;
  Type *local_338;
  not_null<const_slang::ast::Type_*> local_330;
  not_null<const_slang::ast::Expression_*> local_328;
  bitmask<slang::ast::ASTFlags> local_320 [3];
  Expression *local_308;
  Type *local_300;
  bitmask<slang::ast::ASTFlags> local_2f8;
  ExpressionSyntax *local_2f0;
  bitmask<slang::ast::ASTFlags> local_2e8;
  SourceRange local_2e0;
  undefined4 local_2cc;
  AssignmentPatternItemSyntax *local_2c8;
  const_iterator local_2c0;
  const_iterator local_2a0;
  long local_290;
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter> local_288 [2];
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> local_230 [5];
  undefined1 local_150 [16];
  size_t local_140;
  Expression *local_110;
  byte local_101;
  Type *local_100;
  sockaddr *local_f0;
  long local_e8;
  EVP_PKEY_CTX *local_e0;
  StructuredAssignmentPatternExpression *local_d8;
  SourceLocation local_d0;
  undefined1 *local_c8;
  ASTContext *local_c0;
  span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_int,_const_slang::ast::Expression_*>_>
  local_b0;
  SourceLocation local_98;
  undefined1 *local_90;
  iterator local_88;
  size_t local_78;
  SourceLocation local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  SourceRange *local_18;
  SourceLocation local_10;
  undefined1 *local_8;
  
  compilation = (Compilation *)&stack0x00000008;
  local_101 = 0;
  local_110 = (Expression *)0x0;
  local_100 = in_R8;
  local_f0 = in_RDX;
  local_e8 = in_RSI;
  local_e0 = in_RDI;
  SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  ::SmallMap((SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
              *)in_stack_fffffffffffff920);
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL>::SmallVector
            ((SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL> *)
             0x9c00ad);
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL>::SmallVector
            ((SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL> *)
             0x9c00ba);
  local_290 = local_e8 + 0x28;
  local_2a0 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::begin
                        ((SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *)0x9c00db
                        );
  local_2c0 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::end
                        ((SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *)0x9c011a
                        );
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffff910,
                       (iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*> *)
                       in_stack_fffffffffffff908);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_2c8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>,_false>
                ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>,_false>
                             *)0x9c0189);
    pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9c01b4);
    if ((pEVar4->super_SyntaxNode).kind == DefaultPatternKeyExpression) {
      if (local_110 != (Expression *)0x0) {
        local_2cc = 0xf0007;
        not_null<slang::syntax::ExpressionSyntax_*>::operator->
                  ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9c020d);
        SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff960);
        sourceRange_00.endLoc = in_stack_fffffffffffff938;
        sourceRange_00.startLoc = (SourceLocation)in_stack_fffffffffffff930.m_bits;
        local_2e0 = SVar7;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff928,
                            SUB84((ulong)in_stack_fffffffffffff940 >> 0x20,0),sourceRange_00);
        local_101 = 1;
      }
      not_null<slang::syntax::ExpressionSyntax_*>::operator*
                ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9c02c0);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_2e8,None);
      local_110 = Expression::selfDetermined
                            (in_stack_fffffffffffff928,(ExpressionSyntax *)in_stack_fffffffffffff920
                             ,(ASTContext *)in_stack_fffffffffffff918,in_stack_fffffffffffff930);
      bVar1 = Expression::bad((Expression *)in_stack_fffffffffffff910);
      local_101 = (local_101 & 1) != 0 || bVar1;
    }
    else {
      pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                         ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9c037f);
      psVar8 = local_f0;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_2f8,AllowDataType);
      iVar3 = Expression::bind((int)pEVar4,psVar8,(socklen_t)local_2f8.m_bits);
      local_2f0 = (ExpressionSyntax *)CONCAT44(extraout_var,iVar3);
      bVar1 = Expression::bad((Expression *)in_stack_fffffffffffff910);
      if (bVar1) {
        local_101 = 1;
      }
      else if ((local_2f0->super_SyntaxNode).kind == ArrayAndMethod) {
        local_300 = not_null<const_slang::ast::Type_*>::operator*
                              ((not_null<const_slang::ast::Type_*> *)0x9c0434);
        bVar1 = Type::isSimpleType(local_300);
        if (bVar1) {
          not_null<slang::syntax::ExpressionSyntax_*>::operator*
                    ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9c0495);
          SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffff910);
          bitmask<slang::ast::ASTFlags>::bitmask(local_320,None);
          assignmentRange.endLoc = in_stack_fffffffffffff9d8;
          assignmentRange.startLoc = in_stack_fffffffffffff9d0;
          local_308 = Expression::bindRValue
                                ((Type *)CONCAT17(in_stack_fffffffffffff9c7,
                                                  in_stack_fffffffffffff9c0),
                                 (ExpressionSyntax *)in_stack_fffffffffffff9b8,assignmentRange,
                                 in_stack_fffffffffffff9b0,in_stack_fffffffffffff9c8);
          local_338 = local_300;
          not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                    (&local_330,&local_338);
          local_340 = local_308;
          not_null<const_slang::ast::Expression_*>::not_null<const_slang::ast::Expression_*>
                    (&local_328,&local_340);
          SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
          emplace_back<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                    (&in_stack_fffffffffffff918->
                      super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                     ,(TypeSetter *)in_stack_fffffffffffff910);
          bVar1 = Expression::bad((Expression *)in_stack_fffffffffffff910);
          local_101 = (local_101 & 1) != 0 || bVar1;
        }
        else {
          in_stack_fffffffffffffcbc = 0x120007;
          not_null<slang::syntax::ExpressionSyntax_*>::operator->
                    ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9c05f3);
          SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff960);
          in_stack_fffffffffffffa70 = SVar7.endLoc;
          sourceRange_01.endLoc = in_stack_fffffffffffff938;
          sourceRange_01.startLoc = (SourceLocation)in_stack_fffffffffffff930.m_bits;
          in_stack_fffffffffffffcb0 = in_stack_fffffffffffffa70;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff928,
                              SUB84((ulong)in_stack_fffffffffffff940 >> 0x20,0),sourceRange_01);
          local_101 = 1;
        }
      }
      else {
        psVar8 = local_f0;
        pEVar4 = local_2f0;
        elementType_00 = local_100;
        pEVar5 = (Expression *)
                 not_null<slang::syntax::ExpressionSyntax_*>::operator*
                           ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9c06b0);
        in_stack_fffffffffffffa48 =
             (_Optional_payload_base<int>)
             bindArrayIndexSetter
                       ((ASTContext *)in_stack_fffffffffffffa70,pEVar5,elementType_00,pEVar4,
                        (SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                         *)psVar8,
                        (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                         *)in_stack_fffffffffffffa48);
        bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x9c0716);
        if (bVar1) {
          in_stack_fffffffffffffc98 = Type::getFixedRange(in_stack_fffffffffffff908);
          std::optional<int>::operator*((optional<int> *)0x9c075b);
          bVar1 = ConstantRange::containsPoint
                            ((ConstantRange *)in_stack_fffffffffffff920,
                             (int32_t)((ulong)in_stack_fffffffffffff918 >> 0x20));
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            in_stack_fffffffffffffc8c = 0x5c0007;
            in_stack_fffffffffffffc78 = (FieldSymbol *)local_2f0[1].super_SyntaxNode.parent;
            in_stack_fffffffffffffc80 = (Type *)local_2f0[1].super_SyntaxNode.previewNode;
            sourceRange_02.endLoc = in_stack_fffffffffffff938;
            sourceRange_02.startLoc = (SourceLocation)in_stack_fffffffffffff930.m_bits;
            in_stack_fffffffffffffc90 =
                 (SourceLocation)
                 ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff928,
                                     SUB84((ulong)in_stack_fffffffffffff940 >> 0x20,0),
                                     sourceRange_02);
            std::optional<int>::operator*((optional<int> *)0x9c07ff);
            Diagnostic::operator<<<int>
                      (in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20));
            ast::operator<<(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
            local_101 = 1;
          }
        }
        else {
          local_101 = 1;
        }
      }
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>,_false>
                *)in_stack_fffffffffffff910);
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x9c0854);
  std::optional<const_slang::ast::Expression_*>::optional
            ((optional<const_slang::ast::Expression_*> *)0x9c0861);
  local_3e0 = Type::getFixedRange(in_stack_fffffffffffff908);
  local_3e4 = ConstantRange::lower((ConstantRange *)0x9c0895);
  do {
    iVar3 = local_3e4;
    iVar2 = ConstantRange::upper((ConstantRange *)0x9c08c7);
    if (iVar2 < iVar3) {
LAB_009c0ec7:
      std::
      span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
      ::span((span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
              *)0x9c0eee);
      local_488.sourceRange.startLoc._0_4_ =
           SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::copy
                     (local_288,local_e0,src);
      local_488.sourceRange.startLoc._4_4_ = extraout_var_00;
      iVar3 = SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::copy
                        (local_230,local_e0,src_00);
      local_488.constant = (ConstantValue *)CONCAT44(extraout_var_01,iVar3);
      local_488.kind =
           SmallVectorBase<const_slang::ast::Expression_*>::copy(&local_3c8,local_e0,src_01);
      local_488._4_4_ = extraout_var_02;
      pEVar5 = &local_488;
      local_448 = BumpAllocator::
                  emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                            ((BumpAllocator *)in_stack_fffffffffffff9d0,
                             (Type *)in_stack_fffffffffffff9c8.m_bits,
                             (span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                              *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
                             in_stack_fffffffffffff9b8,
                             (span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
                              *)in_stack_fffffffffffff9b0,(Expression **)in_stack_fffffffffffff9a8,
                             (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
                             in_stack_fffffffffffff9f0,in_stack_fffffffffffff9f8);
      local_d8 = local_448;
      if ((local_101 & 1) != 0) {
        local_d8 = (StructuredAssignmentPatternExpression *)Expression::badExpr(compilation,pEVar5);
      }
      SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x9c1064);
      SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL>::~SmallVector
                ((SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL> *)
                 0x9c1071);
      SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL>::~SmallVector
                ((SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL> *
                 )0x9c107e);
      SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
      ::~SmallMap((SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                   *)0x9c108b);
      return (Expression *)local_d8;
    }
    local_d0 = (SourceLocation)&local_3e4;
    local_c8 = local_150;
    local_98 = local_d0;
    local_90 = local_150;
    local_70 = local_d0;
    local_68 = local_150;
    local_78 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
               ::hash_for<int>(in_stack_fffffffffffff910,(int *)in_stack_fffffffffffff908);
    in_stack_fffffffffffff9f0 = local_70;
    in_stack_fffffffffffff9f8 =
         (SourceRange *)
         boost::unordered::detail::foa::
         table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
         ::position_for(in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
    local_20 = local_78;
    local_18 = in_stack_fffffffffffff9f8;
    local_10 = in_stack_fffffffffffff9f0;
    local_8 = local_150;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_30,(size_t)in_stack_fffffffffffff9f8);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                 ::groups((table_arrays<std::pair<const_int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                           *)0x9c0a37);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffff918,(size_t)in_stack_fffffffffffff910);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                   ::elements((table_arrays<std::pair<const_int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                               *)0x9c0a99);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffff9c8.m_bits =
               (underlying_type)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
               ::pred((table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                       *)0x9c0aec);
          in_stack_fffffffffffff9d0 = local_10;
          __y = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
                ::key_from<std::pair<int_const,slang::ast::Expression_const*>>
                          ((pair<const_int,_const_slang::ast::Expression_*> *)0x9c0b1f);
          bVar1 = std::equal_to<int>::operator()
                            ((equal_to<int> *)in_stack_fffffffffffff9c8.m_bits,
                             (int *)in_stack_fffffffffffff9d0,__y);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_int,_const_slang::ast::Expression_*>_>
            ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
            goto LAB_009c0c3b;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      in_stack_fffffffffffff9c7 =
           boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
      if ((bool)in_stack_fffffffffffff9c7) {
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_int,_const_slang::ast::Expression_*>_>
        ::table_locator(&local_b0);
        goto LAB_009c0c3b;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_30,local_140);
    } while (bVar1);
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_int,_const_slang::ast::Expression_*>_>
    ::table_locator(&local_b0);
LAB_009c0c3b:
    local_88 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
               ::make_iterator((locator *)0x9c0c4a);
    local_c0 = (ASTContext *)local_88.pc_;
    local_b8 = (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                *)local_88.p_;
    local_3f8 = (ASTContext *)local_88.pc_;
    local_3f0 = (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                 *)local_88.p_;
    in_stack_fffffffffffff9a8 =
         (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
          *)local_88.p_;
    in_stack_fffffffffffff9b0 = (ASTContext *)local_88.pc_;
    in_stack_fffffffffffff9b8 =
         (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
          *)local_88.p_;
    local_408 = boost::unordered::
                unordered_flat_map<int,_const_slang::ast::Expression_*,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                ::end((unordered_flat_map<int,_const_slang::ast::Expression_*,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                       *)0x9c0ce7);
    bVar1 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)in_stack_fffffffffffff910,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)in_stack_fffffffffffff908);
    if (bVar1) {
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    *)in_stack_fffffffffffff910);
      SmallVectorBase<const_slang::ast::Expression_*>::push_back
                ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffff910,
                 (Expression **)in_stack_fffffffffffff908);
    }
    else {
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<const_slang::ast::Expression_*> *)0x9c0d7d);
      if (!bVar1) {
        SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff960);
        local_430 = SVar7;
        std::
        span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
        ::
        span<slang::SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL>_&>
                  ((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                    *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
        SVar7.endLoc = (SourceLocation)in_stack_fffffffffffffc98;
        SVar7.startLoc = in_stack_fffffffffffffc90;
        typeSetters_00._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffcb8;
        typeSetters_00._M_ptr = (pointer)in_stack_fffffffffffffcb0;
        typeSetters_00._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffcbc;
        in_stack_fffffffffffff908 = local_440;
        in_stack_fffffffffffff910 = ptStack_438;
        local_420 = matchElementValue((ASTContext *)
                                      CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                                      in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,SVar7,
                                      typeSetters_00,in_stack_fffffffffffffc70);
        std::optional<const_slang::ast::Expression_*>::
        optional<const_slang::ast::Expression_*,_true>
                  ((optional<const_slang::ast::Expression_*> *)in_stack_fffffffffffff910,
                   (Expression **)in_stack_fffffffffffff908);
        local_3d8 = local_418;
        uStack_3d0 = uStack_410;
        ppEVar6 = std::optional<const_slang::ast::Expression_*>::value
                            ((optional<const_slang::ast::Expression_*> *)in_stack_fffffffffffff910);
        if (*ppEVar6 == (Expression *)0x0) {
          local_101 = 1;
          goto LAB_009c0ec7;
        }
      }
      std::optional<const_slang::ast::Expression_*>::operator*
                ((optional<const_slang::ast::Expression_*> *)0x9c0e9d);
      SmallVectorBase<const_slang::ast::Expression_*>::push_back
                ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffff910,
                 (Expression **)in_stack_fffffffffffff908);
    }
    local_3e4 = local_3e4 + 1;
  } while( true );
}

Assistant:

Expression& StructuredAssignmentPatternExpression::forFixedArray(
    Compilation& comp, const StructuredAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, SourceRange sourceRange) {

    bool bad = false;
    const Expression* defaultSetter = nullptr;
    SmallMap<int32_t, const Expression*, 8> indexMap;
    SmallVector<IndexSetter, 4> indexSetters;
    SmallVector<TypeSetter, 4> typeSetters;

    for (auto item : syntax.items) {
        if (item->key->kind == SyntaxKind::DefaultPatternKeyExpression) {
            if (defaultSetter) {
                context.addDiag(diag::AssignmentPatternKeyDupDefault, item->key->sourceRange());
                bad = true;
            }
            defaultSetter = &selfDetermined(comp, *item->expr, context);
            bad |= defaultSetter->bad();
            continue;
        }

        // The key is either an array index or a data type setter.
        auto& keyExpr = Expression::bind(*item->key, context, ASTFlags::AllowDataType);
        if (keyExpr.bad()) {
            bad = true;
            continue;
        }

        if (keyExpr.kind == ExpressionKind::DataType) {
            const Type& typeKey = *keyExpr.type;
            if (typeKey.isSimpleType()) {
                auto& expr = bindRValue(typeKey, *item->expr, {}, context);
                typeSetters.emplace_back(TypeSetter{&typeKey, &expr});
                bad |= expr.bad();
            }
            else {
                context.addDiag(diag::AssignmentPatternKeyExpr, item->key->sourceRange());
                bad = true;
            }
        }
        else {
            auto index = bindArrayIndexSetter(context, keyExpr, elementType, *item->expr, indexMap,
                                              indexSetters);
            if (!index) {
                bad = true;
                continue;
            }

            if (!type.getFixedRange().containsPoint(*index)) {
                auto& diag = context.addDiag(diag::IndexValueInvalid, keyExpr.sourceRange);
                diag << *index;
                diag << type;
                bad = true;
            }
        }
    }

    SmallVector<const Expression*> elements;
    std::optional<const Expression*> cachedVal;
    auto arrayRange = type.getFixedRange();

    for (int32_t i = arrayRange.lower(); i <= arrayRange.upper(); i++) {
        // If we already have a setter for this index we don't have to do anything else.
        if (auto it = indexMap.find(i); it != indexMap.end()) {
            elements.push_back(it->second);
            continue;
        }

        if (!cachedVal) {
            cachedVal = matchElementValue(context, elementType, nullptr, syntax.sourceRange(),
                                          typeSetters, defaultSetter);
            if (!cachedVal.value()) {
                bad = true;
                break;
            }
        }

        elements.push_back(*cachedVal);
    }

    auto result = comp.emplace<StructuredAssignmentPatternExpression>(
        type, std::span<const MemberSetter>{}, typeSetters.copy(comp), indexSetters.copy(comp),
        defaultSetter, elements.copy(comp), sourceRange);

    if (bad)
        return badExpr(comp, result);

    return *result;
}